

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

bool_t prf_matrix_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  uint16_t uVar1;
  void *pvVar2;
  bfile_t *in_RDX;
  long *in_RSI;
  ushort *in_RDI;
  float32_t fVar3;
  bfile_t *unaff_retaddr;
  node_data_conflict8 *data;
  int pos;
  bfile_t *in_stack_ffffffffffffffd0;
  bfile_t *bfile_00;
  uint in_stack_ffffffffffffffdc;
  int iVar4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  bool_t bVar5;
  
  uVar1 = bf_get_uint16_be(in_stack_ffffffffffffffd0);
  *in_RDI = uVar1;
  if (*in_RDI == prf_matrix_info.opcode) {
    uVar1 = bf_get_uint16_be(in_stack_ffffffffffffffd0);
    in_RDI[1] = uVar1;
    if (in_RDI[1] < 0x44) {
      prf_error(9,"matrix node too short (%d bytes)",(ulong)in_RDI[1]);
      bf_rewind(in_RDX,in_stack_ffffffffffffffdc);
      bVar5 = 0;
    }
    else {
      if ((4 < in_RDI[1]) && (*(long *)(in_RDI + 4) == 0)) {
        if (*(short *)(*in_RSI + 8) == 0) {
          pvVar2 = malloc((long)(int)(in_RDI[1] - 4));
          *(void **)(in_RDI + 4) = pvVar2;
        }
        else {
          pvVar2 = pool_malloc((pool_t)((ulong)in_RSI >> 0x30),(int)in_RSI);
          *(void **)(in_RDI + 4) = pvVar2;
        }
        if (*(long *)(in_RDI + 4) == 0) {
          prf_error(9,"memory allocation problem (returned NULL)");
          bf_rewind(in_RDX,in_stack_ffffffffffffffdc);
          return 0;
        }
      }
      iVar4 = 4;
      bfile_00 = *(bfile_t **)(in_RDI + 4);
      fVar3 = bf_get_float32_be(bfile_00);
      *(float32_t *)bfile_00 = fVar3;
      iVar4 = iVar4 + 4;
      fVar3 = bf_get_float32_be(bfile_00);
      *(float32_t *)&bfile_00->size = fVar3;
      iVar4 = iVar4 + 4;
      fVar3 = bf_get_float32_be(bfile_00);
      *(float32_t *)&bfile_00->ipos = fVar3;
      iVar4 = iVar4 + 4;
      fVar3 = bf_get_float32_be(bfile_00);
      *(float32_t *)&bfile_00->buffer = fVar3;
      iVar4 = iVar4 + 4;
      fVar3 = bf_get_float32_be(bfile_00);
      *(float32_t *)&bfile_00->field_0x4 = fVar3;
      iVar4 = iVar4 + 4;
      fVar3 = bf_get_float32_be(bfile_00);
      *(float32_t *)((long)&bfile_00->size + 4) = fVar3;
      iVar4 = iVar4 + 4;
      fVar3 = bf_get_float32_be(bfile_00);
      *(float32_t *)((long)&bfile_00->ipos + 4) = fVar3;
      iVar4 = iVar4 + 4;
      fVar3 = bf_get_float32_be(bfile_00);
      *(float32_t *)((long)&bfile_00->buffer + 4) = fVar3;
      iVar4 = iVar4 + 4;
      fVar3 = bf_get_float32_be(bfile_00);
      *(float32_t *)&bfile_00->file = fVar3;
      iVar4 = iVar4 + 4;
      fVar3 = bf_get_float32_be(bfile_00);
      *(float32_t *)&bfile_00->pos = fVar3;
      iVar4 = iVar4 + 4;
      fVar3 = bf_get_float32_be(bfile_00);
      *(float32_t *)&bfile_00->filename = fVar3;
      iVar4 = iVar4 + 4;
      fVar3 = bf_get_float32_be(bfile_00);
      bfile_00->buffer_size = (uint32_t)fVar3;
      iVar4 = iVar4 + 4;
      fVar3 = bf_get_float32_be(bfile_00);
      *(float32_t *)((long)&bfile_00->file + 4) = fVar3;
      iVar4 = iVar4 + 4;
      fVar3 = bf_get_float32_be(bfile_00);
      *(float32_t *)((long)&bfile_00->pos + 4) = fVar3;
      iVar4 = iVar4 + 4;
      fVar3 = bf_get_float32_be(bfile_00);
      *(float32_t *)((long)&bfile_00->filename + 4) = fVar3;
      iVar4 = iVar4 + 4;
      fVar3 = bf_get_float32_be(bfile_00);
      *(float32_t *)&bfile_00->field_0x3c = fVar3;
      if (iVar4 + 4 < (int)(uint)in_RDI[1]) {
        bf_read(unaff_retaddr,
                (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                (uint)((ulong)in_RDI >> 0x20));
      }
      bVar5 = 1;
    }
  }
  else {
    prf_error(9,"tried matrix node load method on node of type %d.",(ulong)*in_RDI);
    bf_rewind(in_RDX,in_stack_ffffffffffffffdc);
    bVar5 = 0;
  }
  return bVar5;
}

Assistant:

static
bool_t
prf_matrix_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_matrix_info.opcode ) {
        prf_error( 9,
            "tried matrix node load method on node of type %d.",
            node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }

    node->length = bf_get_uint16_be( bfile );
    if ( node->length < NODE_DATA_SIZE + 4 ) {
        prf_error( 9, "matrix node too short (%d bytes)", node->length );
        bf_rewind( bfile, 4 );
        return FALSE;
    }

    if ( node->length > 4 && node->data == NULL ) {
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *)malloc( node->length - 4 + NODE_DATA_PAD );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 + NODE_DATA_PAD );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;
        data->matrix[0][0] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[1][0] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[2][0] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[3][0] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[0][1] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[1][1] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[2][1] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[3][1] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[0][2] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[1][2] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[2][2] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[3][2] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[0][3] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[1][3] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[2][3] = bf_get_float32_be( bfile ); pos += 4;
        data->matrix[3][3] = bf_get_float32_be( bfile ); pos += 4;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_read( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}